

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# M3DImporter.cpp
# Opt level: O0

void __thiscall Assimp::M3DImporter::importMeshes(M3DImporter *this,M3DWrapper *m3d)

{
  undefined1 auVar1 [16];
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar2;
  M3D_INDEX MVar3;
  uint uVar4;
  bool bVar5;
  vector<aiFace,_std::allocator<aiFace>_> *pvVar6;
  Logger *this_00;
  m3d_t *pmVar7;
  basic_formatter *this_01;
  size_type sVar8;
  aiMesh *paVar9;
  vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *pvVar10;
  vector<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_> *pvVar11;
  aiFace *this_02;
  ulong uVar12;
  uint *puVar13;
  aiMesh **ppaVar14;
  iterator __first;
  iterator __last;
  aiColor4D local_254;
  undefined1 local_244 [8];
  aiVector3D norm;
  aiVector3D uv;
  aiVector3D pos;
  aiFace *pFace;
  basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> local_208;
  string local_90;
  value_type local_70;
  aiMesh *pMesh;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *vertexids;
  vector<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_> *colors;
  vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *texcoords;
  vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *normals;
  vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *vertices;
  vector<aiFace,_std::allocator<aiFace>_> *faces;
  vector<aiMesh_*,_std::allocator<aiMesh_*>_> *meshes;
  uint lastMat;
  uint numpoly;
  uint l;
  uint k;
  uint j;
  uint i;
  M3DWrapper *m3d_local;
  M3DImporter *this_local;
  
  meshes._4_4_ = 3;
  meshes._0_4_ = 0xfffffffe;
  _j = m3d;
  m3d_local = (M3DWrapper *)this;
  pvVar6 = (vector<aiFace,_std::allocator<aiFace>_> *)operator_new(0x18);
  memset(pvVar6,0,0x18);
  std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::vector
            ((vector<aiMesh_*,_std::allocator<aiMesh_*>_> *)pvVar6);
  vertices = (vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)0x0;
  normals = (vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)0x0;
  texcoords = (vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)0x0;
  colors = (vector<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_> *)0x0;
  vertexids = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
  pMesh = (aiMesh *)0x0;
  local_70 = (aiMesh *)0x0;
  faces = pvVar6;
  if (this->mScene == (aiScene *)0x0) {
    __assert_fail("mScene != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/M3D/M3DImporter.cpp"
                  ,0x180,"void Assimp::M3DImporter::importMeshes(const M3DWrapper &)");
  }
  bVar5 = M3DWrapper::operator_cast_to_bool(_j);
  if (bVar5) {
    if (this->mScene->mRootNode == (aiNode *)0x0) {
      __assert_fail("mScene->mRootNode != nullptr",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/M3D/M3DImporter.cpp"
                    ,0x182,"void Assimp::M3DImporter::importMeshes(const M3DWrapper &)");
    }
    this_00 = DefaultLogger::get();
    Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
    basic_formatter<char[19]>(&local_208,(char (*) [19])"M3D: importMeshes ");
    pmVar7 = M3DWrapper::operator->(_j);
    this_01 = (basic_formatter *)
              Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
              operator_((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                        &local_208,&pmVar7->numface);
    Formatter::basic_formatter::operator_cast_to_string(&local_90,this_01);
    Logger::debug(this_00,&local_90);
    std::__cxx11::string::~string((string *)&local_90);
    Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
    ~basic_formatter(&local_208);
    for (k = 0; uVar4 = k, pmVar7 = M3DWrapper::operator->(_j), MVar3 = (M3D_INDEX)meshes,
        uVar4 < pmVar7->numface; k = k + 1) {
      pmVar7 = M3DWrapper::operator->(_j);
      if (MVar3 != pmVar7->face[k].materialid) {
        pmVar7 = M3DWrapper::operator->(_j);
        meshes._0_4_ = pmVar7->face[k].materialid;
        if ((((local_70 != (aiMesh *)0x0) &&
             (normals != (vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)0x0)) &&
            (sVar8 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::size
                               (normals), sVar8 != 0)) &&
           ((vertices != (vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)0x0 &&
            (sVar8 = std::vector<aiFace,_std::allocator<aiFace>_>::size
                               ((vector<aiFace,_std::allocator<aiFace>_> *)vertices), sVar8 != 0))))
        {
          populateMesh(this,_j,local_70,(vector<aiFace,_std::allocator<aiFace>_> *)vertices,normals,
                       texcoords,
                       (vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)colors,
                       (vector<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_> *)vertexids,
                       (vector<unsigned_int,_std::allocator<unsigned_int>_> *)pMesh);
          std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::push_back
                    ((vector<aiMesh_*,_std::allocator<aiMesh_*>_> *)faces,&local_70);
          pvVar10 = vertices;
          if (vertices != (vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)0x0) {
            std::vector<aiFace,_std::allocator<aiFace>_>::~vector
                      ((vector<aiFace,_std::allocator<aiFace>_> *)vertices);
            operator_delete(pvVar10,0x18);
          }
          pvVar10 = normals;
          if (normals != (vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)0x0) {
            std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::~vector(normals);
            operator_delete(pvVar10,0x18);
          }
          pvVar10 = texcoords;
          if (texcoords != (vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)0x0) {
            std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::~vector(texcoords);
            operator_delete(pvVar10,0x18);
          }
          pvVar11 = colors;
          if (colors != (vector<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_> *)0x0) {
            std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::~vector
                      ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)colors);
            operator_delete(pvVar11,0x18);
          }
          pvVar2 = vertexids;
          if (vertexids != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
            std::vector<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>::~vector
                      ((vector<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_> *)vertexids);
            operator_delete(pvVar2,0x18);
          }
          paVar9 = pMesh;
          if (pMesh != (aiMesh *)0x0) {
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)pMesh);
            operator_delete(paVar9,0x18);
          }
        }
        paVar9 = (aiMesh *)operator_new(0x520);
        aiMesh::aiMesh(paVar9);
        paVar9->mPrimitiveTypes = 4;
        paVar9->mMaterialIndex = (M3D_INDEX)meshes + 1;
        local_70 = paVar9;
        pvVar6 = (vector<aiFace,_std::allocator<aiFace>_> *)operator_new(0x18);
        memset(pvVar6,0,0x18);
        std::vector<aiFace,_std::allocator<aiFace>_>::vector(pvVar6);
        vertices = (vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)pvVar6;
        pvVar10 = (vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)
                  operator_new(0x18);
        memset(pvVar10,0,0x18);
        std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::vector(pvVar10);
        normals = pvVar10;
        pvVar10 = (vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)
                  operator_new(0x18);
        memset(pvVar10,0,0x18);
        std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::vector(pvVar10);
        texcoords = pvVar10;
        pvVar11 = (vector<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_> *)operator_new(0x18)
        ;
        memset(pvVar11,0,0x18);
        std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::vector
                  ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)pvVar11);
        colors = pvVar11;
        pvVar11 = (vector<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_> *)operator_new(0x18)
        ;
        memset(pvVar11,0,0x18);
        std::vector<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>::vector(pvVar11);
        vertexids = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)pvVar11;
        paVar9 = (aiMesh *)operator_new(0x18);
        memset(paVar9,0,0x18);
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)paVar9);
        pMesh = paVar9;
      }
      this_02 = (aiFace *)operator_new(0x10);
      aiFace::aiFace(this_02);
      this_02->mNumIndices = meshes._4_4_;
      uVar12 = SUB168(ZEXT416(meshes._4_4_) * ZEXT816(4),0);
      if (SUB168(ZEXT416(meshes._4_4_) * ZEXT816(4),8) != 0) {
        uVar12 = 0xffffffffffffffff;
      }
      puVar13 = (uint *)operator_new__(uVar12);
      this_02->mIndices = puVar13;
      for (l = 0; l < meshes._4_4_; l = l + 1) {
        aiVector3t<float>::aiVector3t((aiVector3t<float> *)&uv.y);
        aiVector3t<float>::aiVector3t((aiVector3t<float> *)&norm.y);
        aiVector3t<float>::aiVector3t((aiVector3t<float> *)local_244);
        sVar8 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::size(normals);
        numpoly = (uint)sVar8;
        this_02->mIndices[l] = numpoly;
        pmVar7 = M3DWrapper::operator->(_j);
        lastMat = pmVar7->face[k].vertex[l];
        pmVar7 = M3DWrapper::operator->(_j);
        uv.y = pmVar7->vertex[lastMat].x;
        pmVar7 = M3DWrapper::operator->(_j);
        uv.z = pmVar7->vertex[lastMat].y;
        M3DWrapper::operator->(_j);
        std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
                  (normals,(value_type *)&uv.y);
        pvVar2 = vertexids;
        pmVar7 = M3DWrapper::operator->(_j);
        local_254 = mkColor(this,pmVar7->vertex[lastMat].color);
        std::vector<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>::push_back
                  ((vector<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_> *)pvVar2,&local_254
                  );
        pmVar7 = M3DWrapper::operator->(_j);
        if (((pmVar7->vertex[lastMat].skinid != 0xffffffff) &&
            (pmVar7 = M3DWrapper::operator->(_j), pmVar7->vertex[lastMat].skinid != 0xfffffffe)) &&
           ((pmVar7 = M3DWrapper::operator->(_j), pmVar7->skin != (m3ds_t *)0x0 &&
            (pmVar7 = M3DWrapper::operator->(_j), pmVar7->bone != (m3db_t *)0x0)))) {
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)pMesh,&lastMat);
        }
        pmVar7 = M3DWrapper::operator->(_j);
        lastMat = pmVar7->face[k].texcoord[l];
        if (lastMat != 0xffffffff) {
          pmVar7 = M3DWrapper::operator->(_j);
          norm.y = pmVar7->tmap[lastMat].u;
          pmVar7 = M3DWrapper::operator->(_j);
          norm.z = pmVar7->tmap[lastMat].v;
          uv.x = 0.0;
          std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
                    ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)colors,
                     (value_type *)&norm.y);
        }
        pmVar7 = M3DWrapper::operator->(_j);
        lastMat = pmVar7->face[k].normal[l];
        if (lastMat != 0xffffffff) {
          pmVar7 = M3DWrapper::operator->(_j);
          local_244._0_4_ = pmVar7->vertex[lastMat].x;
          pmVar7 = M3DWrapper::operator->(_j);
          local_244._4_4_ = pmVar7->vertex[lastMat].y;
          pmVar7 = M3DWrapper::operator->(_j);
          norm.x = pmVar7->vertex[lastMat].z;
          std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
                    (texcoords,(value_type *)local_244);
        }
      }
      std::vector<aiFace,_std::allocator<aiFace>_>::push_back
                ((vector<aiFace,_std::allocator<aiFace>_> *)vertices,this_02);
      if (this_02 != (aiFace *)0x0) {
        aiFace::~aiFace(this_02);
        operator_delete(this_02,0x10);
      }
    }
    if (((local_70 != (aiMesh *)0x0) &&
        (sVar8 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::size(normals),
        sVar8 != 0)) &&
       (sVar8 = std::vector<aiFace,_std::allocator<aiFace>_>::size
                          ((vector<aiFace,_std::allocator<aiFace>_> *)vertices), sVar8 != 0)) {
      populateMesh(this,_j,local_70,(vector<aiFace,_std::allocator<aiFace>_> *)vertices,normals,
                   texcoords,
                   (vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)colors,
                   (vector<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_> *)vertexids,
                   (vector<unsigned_int,_std::allocator<unsigned_int>_> *)pMesh);
      std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::push_back
                ((vector<aiMesh_*,_std::allocator<aiMesh_*>_> *)faces,&local_70);
    }
    sVar8 = std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::size
                      ((vector<aiMesh_*,_std::allocator<aiMesh_*>_> *)faces);
    this->mScene->mNumMeshes = (uint)sVar8;
    auVar1 = ZEXT416(this->mScene->mNumMeshes) * ZEXT816(8);
    uVar12 = auVar1._0_8_;
    if (auVar1._8_8_ != 0) {
      uVar12 = 0xffffffffffffffff;
    }
    ppaVar14 = (aiMesh **)operator_new__(uVar12);
    this->mScene->mMeshes = ppaVar14;
    __first = std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::begin
                        ((vector<aiMesh_*,_std::allocator<aiMesh_*>_> *)faces);
    __last = std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::end
                       ((vector<aiMesh_*,_std::allocator<aiMesh_*>_> *)faces);
    std::
    copy<__gnu_cxx::__normal_iterator<aiMesh**,std::vector<aiMesh*,std::allocator<aiMesh*>>>,aiMesh**>
              ((__normal_iterator<aiMesh_**,_std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>_>)
               __first._M_current,
               (__normal_iterator<aiMesh_**,_std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>_>)
               __last._M_current,this->mScene->mMeshes);
    sVar8 = std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::size
                      ((vector<aiMesh_*,_std::allocator<aiMesh_*>_> *)faces);
    this->mScene->mRootNode->mNumMeshes = (uint)sVar8;
    sVar8 = std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::size
                      ((vector<aiMesh_*,_std::allocator<aiMesh_*>_> *)faces);
    auVar1._8_8_ = 0;
    auVar1._0_8_ = sVar8;
    uVar12 = SUB168(auVar1 * ZEXT816(4),0);
    if (SUB168(auVar1 * ZEXT816(4),8) != 0) {
      uVar12 = 0xffffffffffffffff;
    }
    puVar13 = (uint *)operator_new__(uVar12);
    this->mScene->mRootNode->mMeshes = puVar13;
    for (k = 0; uVar12 = (ulong)k,
        sVar8 = std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::size
                          ((vector<aiMesh_*,_std::allocator<aiMesh_*>_> *)faces), pvVar6 = faces,
        uVar12 < sVar8; k = k + 1) {
      this->mScene->mRootNode->mMeshes[k] = k;
    }
    if (faces != (vector<aiFace,_std::allocator<aiFace>_> *)0x0) {
      std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::~vector
                ((vector<aiMesh_*,_std::allocator<aiMesh_*>_> *)faces);
      operator_delete(pvVar6,0x18);
    }
    pvVar10 = vertices;
    if ((vertices != (vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)0x0) &&
       (vertices != (vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)0x0)) {
      std::vector<aiFace,_std::allocator<aiFace>_>::~vector
                ((vector<aiFace,_std::allocator<aiFace>_> *)vertices);
      operator_delete(pvVar10,0x18);
    }
    pvVar10 = normals;
    if ((normals != (vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)0x0) &&
       (normals != (vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)0x0)) {
      std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::~vector(normals);
      operator_delete(pvVar10,0x18);
    }
    pvVar10 = texcoords;
    if ((texcoords != (vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)0x0) &&
       (texcoords != (vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)0x0)) {
      std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::~vector(texcoords);
      operator_delete(pvVar10,0x18);
    }
    pvVar11 = colors;
    if ((colors != (vector<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_> *)0x0) &&
       (colors != (vector<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_> *)0x0)) {
      std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::~vector
                ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)colors);
      operator_delete(pvVar11,0x18);
    }
    pvVar2 = vertexids;
    if ((vertexids != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) &&
       (vertexids != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0)) {
      std::vector<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>::~vector
                ((vector<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_> *)vertexids);
      operator_delete(pvVar2,0x18);
    }
    paVar9 = pMesh;
    if ((pMesh != (aiMesh *)0x0) && (pMesh != (aiMesh *)0x0)) {
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)pMesh);
      operator_delete(paVar9,0x18);
    }
    return;
  }
  __assert_fail("m3d",
                "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/M3D/M3DImporter.cpp"
                ,0x181,"void Assimp::M3DImporter::importMeshes(const M3DWrapper &)");
}

Assistant:

void M3DImporter::importMeshes(const M3DWrapper &m3d) {
	unsigned int i, j, k, l, numpoly = 3, lastMat = M3D_INDEXMAX;
	std::vector<aiMesh *> *meshes = new std::vector<aiMesh *>();
	std::vector<aiFace> *faces = nullptr;
	std::vector<aiVector3D> *vertices = nullptr;
	std::vector<aiVector3D> *normals = nullptr;
	std::vector<aiVector3D> *texcoords = nullptr;
	std::vector<aiColor4D> *colors = nullptr;
	std::vector<unsigned int> *vertexids = nullptr;
	aiMesh *pMesh = nullptr;

	ai_assert(mScene != nullptr);
	ai_assert(m3d);
	ai_assert(mScene->mRootNode != nullptr);

	ASSIMP_LOG_DEBUG_F("M3D: importMeshes ", m3d->numface);

	for (i = 0; i < m3d->numface; i++) {
		// we must switch mesh if material changes
		if (lastMat != m3d->face[i].materialid) {
			lastMat = m3d->face[i].materialid;
			if (pMesh && vertices && vertices->size() && faces && faces->size()) {
				populateMesh(m3d, pMesh, faces, vertices, normals, texcoords, colors, vertexids);
				meshes->push_back(pMesh);
				delete faces;
				delete vertices;
				delete normals;
				delete texcoords;
				delete colors;
				delete vertexids; // this is not stored in pMesh, just to collect bone vertices
			}
			pMesh = new aiMesh;
			pMesh->mPrimitiveTypes = aiPrimitiveType_TRIANGLE;
			pMesh->mMaterialIndex = lastMat + 1;
			faces = new std::vector<aiFace>();
			vertices = new std::vector<aiVector3D>();
			normals = new std::vector<aiVector3D>();
			texcoords = new std::vector<aiVector3D>();
			colors = new std::vector<aiColor4D>();
			vertexids = new std::vector<unsigned int>();
		}
		// add a face to temporary vector
		aiFace *pFace = new aiFace;
		pFace->mNumIndices = numpoly;
		pFace->mIndices = new unsigned int[numpoly];
		for (j = 0; j < numpoly; j++) {
			aiVector3D pos, uv, norm;
			k = static_cast<unsigned int>(vertices->size());
			pFace->mIndices[j] = k;
			l = m3d->face[i].vertex[j];
			pos.x = m3d->vertex[l].x;
			pos.y = m3d->vertex[l].y;
			pos.z = m3d->vertex[l].z;
			vertices->push_back(pos);
			colors->push_back(mkColor(m3d->vertex[l].color));
			// add a bone to temporary vector
			if (m3d->vertex[l].skinid != M3D_UNDEF && m3d->vertex[l].skinid != M3D_INDEXMAX && m3d->skin && m3d->bone) {
				// this is complicated, because M3D stores a list of bone id / weight pairs per
				// vertex but assimp uses lists of local vertex id/weight pairs per local bone list
				vertexids->push_back(l);
			}
			l = m3d->face[i].texcoord[j];
			if (l != M3D_UNDEF) {
				uv.x = m3d->tmap[l].u;
				uv.y = m3d->tmap[l].v;
				uv.z = 0.0;
				texcoords->push_back(uv);
			}
			l = m3d->face[i].normal[j];
			if (l != M3D_UNDEF) {
				norm.x = m3d->vertex[l].x;
				norm.y = m3d->vertex[l].y;
				norm.z = m3d->vertex[l].z;
				normals->push_back(norm);
			}
		}
		faces->push_back(*pFace);
		delete pFace;
	}
	// if there's data left in the temporary vectors, flush them
	if (pMesh && vertices->size() && faces->size()) {
		populateMesh(m3d, pMesh, faces, vertices, normals, texcoords, colors, vertexids);
		meshes->push_back(pMesh);
	}

	// create global mesh list in scene
	mScene->mNumMeshes = static_cast<unsigned int>(meshes->size());
	mScene->mMeshes = new aiMesh *[mScene->mNumMeshes];
	std::copy(meshes->begin(), meshes->end(), mScene->mMeshes);

	// create mesh indeces in root node
	mScene->mRootNode->mNumMeshes = static_cast<unsigned int>(meshes->size());
	mScene->mRootNode->mMeshes = new unsigned int[meshes->size()];
	for (i = 0; i < meshes->size(); i++) {
		mScene->mRootNode->mMeshes[i] = i;
	}

	delete meshes;
	if (faces) delete faces;
	if (vertices) delete vertices;
	if (normals) delete normals;
	if (texcoords) delete texcoords;
	if (colors) delete colors;
	if (vertexids) delete vertexids;
}